

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QFileDialogPrivate::navigateForward(QFileDialogPrivate *this)

{
  pointer pHVar1;
  long lVar2;
  
  lVar2 = (this->currentHistory).d.size;
  if ((lVar2 != 0) && ((long)this->currentHistoryLocation < lVar2 + -1)) {
    saveHistorySelection(this);
    lVar2 = (long)this->currentHistoryLocation + 1;
    this->currentHistoryLocation = (int)lVar2;
    pHVar1 = QList<QFileDialogPrivate::HistoryItem>::data(&this->currentHistory);
    navigate(this,pHVar1 + lVar2);
    return;
  }
  return;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }